

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlgorithmAreaAverageRgb.cpp
# Opt level: O3

QRgb __thiscall
AlgorithmAreaAverageRgb::GetAverageColourInArea
          (AlgorithmAreaAverageRgb *this,QImage *image,QPoint *location,int areaSize)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int y;
  int iVar7;
  int iVar8;
  
  iVar6 = location->xp - areaSize / 2;
  iVar8 = location->yp - areaSize / 2;
  iVar1 = QImage::width();
  iVar5 = iVar1 - areaSize;
  if (iVar6 <= iVar1 - areaSize) {
    iVar5 = iVar6;
  }
  iVar1 = 0;
  if (iVar6 < 0) {
    iVar5 = 0;
  }
  iVar2 = QImage::height();
  iVar6 = iVar2 - areaSize;
  if (iVar8 <= iVar2 - areaSize) {
    iVar6 = iVar8;
  }
  if (iVar8 < 0) {
    iVar6 = 0;
  }
  iVar2 = 0;
  iVar8 = 0;
  if (0 < areaSize) {
    iVar4 = iVar5 + areaSize;
    iVar8 = 0;
    iVar2 = 0;
    iVar1 = 0;
    iVar7 = iVar6;
    do {
      do {
        uVar3 = QImage::pixel((int)image,iVar5);
        iVar8 = iVar8 + (uVar3 >> 0x10 & 0xff);
        iVar2 = iVar2 + (uVar3 >> 8 & 0xff);
        iVar1 = iVar1 + (uVar3 & 0xff);
        iVar7 = iVar7 + 1;
      } while (iVar7 < iVar6 + areaSize);
      iVar5 = iVar5 + 1;
      iVar7 = iVar6;
    } while (iVar5 < iVar4);
  }
  iVar5 = (int)((double)areaSize * (double)areaSize);
  return iVar1 / iVar5 & 0xffU | (iVar2 / iVar5 & 0xffU) << 8 | iVar8 / iVar5 << 0x10 | 0xff000000;
}

Assistant:

QRgb AlgorithmAreaAverageRgb::GetAverageColourInArea(const QImage& image, const QPoint& location, int areaSize) const
{
    int totalRed = 0;
    int totalGreen = 0;
    int totalBlue = 0;

    // Make our area surround the target point
    QPoint topLeft = QPoint(location.x() - (areaSize / 2), location.y() - (areaSize / 2));
    // Make sure our area is contained by our RGB and target images
    topLeft.rx() = std::clamp(topLeft.x(), 0, image.width() - areaSize);
    topLeft.ry() = std::clamp(topLeft.y(), 0, image.height() - areaSize);

    for (int x = topLeft.x(); x < topLeft.x() + areaSize; ++x) {
        for (int y = topLeft.y(); y < topLeft.y() + areaSize; ++y) {
            QRgb pixel = image.pixel(x, y);
            totalRed += qRed(pixel);
            totalGreen += qGreen(pixel);
            totalBlue += qBlue(pixel);
        }
    }

    const int count = std::pow(areaSize, 2);
    return qRgb(totalRed / count, totalGreen / count, totalBlue / count);
}